

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O0

int nng_socket_close(nng_socket s)

{
  nni_sock *local_20;
  nni_sock *sock;
  uint32_t local_10;
  int rv;
  nng_socket s_local;
  
  local_10 = s.id;
  sock._4_4_ = nni_sock_find(&local_20,s.id);
  rv = sock._4_4_;
  if (sock._4_4_ == 0) {
    nni_sock_close(local_20);
    rv = 0;
  }
  return rv;
}

Assistant:

int
nng_socket_close(nng_socket s)
{
	int       rv;
	nni_sock *sock;

	// Close is special, because we still want to be able to get
	// a hold on the socket even if shutdown was called.
	if ((rv = nni_sock_find(&sock, s.id)) != 0) {
		return (rv);
	}
	// No release -- close releases it.
	nni_sock_close(sock);
	return (0);
}